

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase.cpp
# Opt level: O2

vector<CNetAddr,_std::allocator<CNetAddr>_> *
LookupIntern(vector<CNetAddr,_std::allocator<CNetAddr>_> *__return_storage_ptr__,string *name,
            uint nMaxSolutions,bool fAllowLookup,DNSLookupFn *dns_lookup_function)

{
  long lVar1;
  bool bVar2;
  undefined4 in_register_00000014;
  CNetAddr *resolved;
  undefined8 this;
  long in_FS_OFFSET;
  string_view str;
  initializer_list<CNetAddr> __l;
  allocator_type local_79;
  CNetAddr local_78;
  CNetAddr addr;
  
  str._M_str._4_4_ = in_register_00000014;
  str._M_str._0_4_ = nMaxSolutions;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  str._M_len = (size_t)(name->_M_dataplus)._M_p;
  bVar2 = util::ContainsNoNUL((util *)name->_M_string_length,str);
  if (bVar2) {
    CNetAddr::CNetAddr(&addr);
    bVar2 = CNetAddr::SetSpecial(&addr,name);
    if (bVar2) {
      CNetAddr::CNetAddr(&local_78,&addr);
      __l._M_len = 1;
      __l._M_array = &local_78;
      std::vector<CNetAddr,_std::allocator<CNetAddr>_>::vector(__return_storage_ptr__,__l,&local_79)
      ;
      prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector(&local_78.m_addr);
      prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector(&addr.m_addr);
    }
    else {
      prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector(&addr.m_addr);
      (__return_storage_ptr__->super__Vector_base<CNetAddr,_std::allocator<CNetAddr>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->super__Vector_base<CNetAddr,_std::allocator<CNetAddr>_>)._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->super__Vector_base<CNetAddr,_std::allocator<CNetAddr>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
      ::operator()((vector<CNetAddr,_std::allocator<CNetAddr>_> *)&addr,dns_lookup_function,name,
                   fAllowLookup);
      this = addr.m_addr._union.indirect_contents.indirect;
      while ((this != addr.m_addr._union._8_8_ &&
             ((nMaxSolutions == 0 ||
              ((ulong)((long)(__return_storage_ptr__->
                             super__Vector_base<CNetAddr,_std::allocator<CNetAddr>_>)._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)(__return_storage_ptr__->
                             super__Vector_base<CNetAddr,_std::allocator<CNetAddr>_>)._M_impl.
                             super__Vector_impl_data._M_start >> 5) < (ulong)nMaxSolutions))))) {
        bVar2 = CNetAddr::IsInternal((CNetAddr *)this);
        if (!bVar2) {
          std::vector<CNetAddr,_std::allocator<CNetAddr>_>::push_back
                    (__return_storage_ptr__,(value_type *)this);
        }
        this = this + 0x20;
      }
      std::vector<CNetAddr,_std::allocator<CNetAddr>_>::~vector
                ((vector<CNetAddr,_std::allocator<CNetAddr>_> *)&addr);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
LAB_00a9a15c:
      __stack_chk_fail();
    }
  }
  else {
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) goto LAB_00a9a15c;
    (__return_storage_ptr__->super__Vector_base<CNetAddr,_std::allocator<CNetAddr>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<CNetAddr,_std::allocator<CNetAddr>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<CNetAddr,_std::allocator<CNetAddr>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<CNetAddr> LookupIntern(const std::string& name, unsigned int nMaxSolutions, bool fAllowLookup, DNSLookupFn dns_lookup_function)
{
    if (!ContainsNoNUL(name)) return {};
    {
        CNetAddr addr;
        // From our perspective, onion addresses are not hostnames but rather
        // direct encodings of CNetAddr much like IPv4 dotted-decimal notation
        // or IPv6 colon-separated hextet notation. Since we can't use
        // getaddrinfo to decode them and it wouldn't make sense to resolve
        // them, we return a network address representing it instead. See
        // CNetAddr::SetSpecial(const std::string&) for more details.
        if (addr.SetSpecial(name)) return {addr};
    }

    std::vector<CNetAddr> addresses;

    for (const CNetAddr& resolved : dns_lookup_function(name, fAllowLookup)) {
        if (nMaxSolutions > 0 && addresses.size() >= nMaxSolutions) {
            break;
        }
        /* Never allow resolving to an internal address. Consider any such result invalid */
        if (!resolved.IsInternal()) {
            addresses.push_back(resolved);
        }
    }

    return addresses;
}